

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lite_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::LiteBasicTest_AllLite23_Test::TestBody
          (LiteBasicTest_AllLite23_Test *this)

{
  TestMapLite message2;
  TestMapLite message1;
  TestMapLite TStack_4b8;
  TestMapLite local_260;
  
  proto2_unittest::TestMapLite::TestMapLite(&local_260,(Arena *)0x0);
  proto2_unittest::TestMapLite::TestMapLite(&TStack_4b8,(Arena *)0x0);
  MapTestUtil::SetMapFields<proto2_unittest::TestMapLite>(&local_260);
  MapTestUtil::SetMapFields<proto2_unittest::TestMapLite>(&TStack_4b8);
  MapTestUtil::ModifyMapFields<proto2_unittest::TestMapLite>(&TStack_4b8);
  if ((local_260.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
    local_260.super_MessageLite._internal_metadata_.ptr_ =
         *(ulong *)(local_260.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffe);
  }
  if ((TStack_4b8.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
    TStack_4b8.super_MessageLite._internal_metadata_.ptr_ =
         *(ulong *)(TStack_4b8.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffe);
  }
  if (local_260.super_MessageLite._internal_metadata_.ptr_ ==
      TStack_4b8.super_MessageLite._internal_metadata_.ptr_) {
    proto2_unittest::TestMapLite::InternalSwap(&local_260,&TStack_4b8);
  }
  else {
    internal::GenericSwap(&local_260.super_MessageLite,&TStack_4b8.super_MessageLite);
  }
  MapTestUtil::ExpectMapFieldsModified<proto2_unittest::TestMapLite>(&local_260);
  MapTestUtil::ExpectMapFieldsSet<proto2_unittest::TestMapLite>(&TStack_4b8);
  proto2_unittest::TestMapLite::~TestMapLite(&TStack_4b8);
  proto2_unittest::TestMapLite::~TestMapLite(&local_260);
  return;
}

Assistant:

TEST(LiteBasicTest, AllLite23) {
  {
    // SwapWithOther
    proto2_unittest::TestMapLite message1, message2;

    MapTestUtil::SetMapFields(&message1);
    MapTestUtil::SetMapFields(&message2);
    MapTestUtil::ModifyMapFields(&message2);

    message1.Swap(&message2);
    MapTestUtil::ExpectMapFieldsModified(message1);
    MapTestUtil::ExpectMapFieldsSet(message2);
  }
}